

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O1

bilingual_str * common::PSBTErrorString(bilingual_str *__return_storage_ptr__,PSBTError err)

{
  long *plVar1;
  long *plVar2;
  long in_FS_OFFSET;
  long *local_c8;
  long local_c0;
  long local_b8 [2];
  long *local_a8;
  long local_a0;
  long local_98 [2];
  long *local_88;
  long local_80;
  long local_78 [2];
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38 [2];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  switch(err) {
  case MISSING_INPUTS:
    plVar2 = local_38;
    local_48 = plVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Inputs missing or spent","");
    (__return_storage_ptr__->original)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->original).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_48,local_40 + (long)local_48);
    (__return_storage_ptr__->translated)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->translated).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->translated,local_48,local_40 + (long)local_48);
    plVar1 = local_48;
    break;
  case SIGHASH_MISMATCH:
    plVar2 = local_58;
    local_68 = plVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Specified sighash value does not match value stored in PSBT","")
    ;
    (__return_storage_ptr__->original)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->original).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_68,local_60 + (long)local_68);
    (__return_storage_ptr__->translated)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->translated).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->translated,local_68,local_60 + (long)local_68);
    plVar1 = local_68;
    break;
  case EXTERNAL_SIGNER_NOT_FOUND:
    plVar2 = local_78;
    local_88 = plVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"External signer not found","");
    (__return_storage_ptr__->original)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->original).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_88,local_80 + (long)local_88);
    (__return_storage_ptr__->translated)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->translated).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->translated,local_88,local_80 + (long)local_88);
    plVar1 = local_88;
    break;
  case EXTERNAL_SIGNER_FAILED:
    plVar2 = local_98;
    local_a8 = plVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,"External signer failed to sign","");
    (__return_storage_ptr__->original)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->original).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_a8,local_a0 + (long)local_a8);
    (__return_storage_ptr__->translated)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->translated).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->translated,local_a8,local_a0 + (long)local_a8);
    plVar1 = local_a8;
    break;
  case UNSUPPORTED:
    plVar2 = local_b8;
    local_c8 = plVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"Signer does not support PSBT","");
    (__return_storage_ptr__->original)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->original).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_c8,local_c0 + (long)local_c8);
    (__return_storage_ptr__->translated)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->translated).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->translated,local_c8,local_c0 + (long)local_c8);
    plVar1 = local_c8;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/common/messages.cpp"
                  ,0x79,"bilingual_str common::PSBTErrorString(PSBTError)");
  }
  if (plVar1 != plVar2) {
    operator_delete(plVar1,*plVar2 + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

bilingual_str PSBTErrorString(PSBTError err)
{
    switch (err) {
        case PSBTError::MISSING_INPUTS:
            return Untranslated("Inputs missing or spent");
        case PSBTError::SIGHASH_MISMATCH:
            return Untranslated("Specified sighash value does not match value stored in PSBT");
        case PSBTError::EXTERNAL_SIGNER_NOT_FOUND:
            return Untranslated("External signer not found");
        case PSBTError::EXTERNAL_SIGNER_FAILED:
            return Untranslated("External signer failed to sign");
        case PSBTError::UNSUPPORTED:
            return Untranslated("Signer does not support PSBT");
        // no default case, so the compiler can warn about missing cases
    }
    assert(false);
}